

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test
          (tuple<long,_double,_double> *__return_storage_ptr__,FastText *this,istream *in,int32_t k,
          real threshold)

{
  uint64_t uVar1;
  double dVar2;
  double dVar3;
  Meter local_98;
  
  local_98.labelMetrics_._M_h._M_buckets = &local_98.labelMetrics_._M_h._M_single_bucket;
  local_98.nexamples_ = 0;
  local_98.metrics_.scoreVsTrue.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.metrics_.scoreVsTrue.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.metrics_.predictedGold = 0;
  local_98.metrics_.scoreVsTrue.
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.metrics_.gold = 0;
  local_98.metrics_.predicted = 0;
  local_98.labelMetrics_._M_h._M_rehash_policy._M_next_resize = 0;
  local_98.labelMetrics_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_98.labelMetrics_._M_h._M_bucket_count = 1;
  local_98.labelMetrics_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98.labelMetrics_._M_h._M_element_count = 0;
  local_98.labelMetrics_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_98.labelMetrics_._M_h._M_rehash_policy._4_4_ = 0;
  local_98.falseNegativeLabels_ = false;
  test(this,in,k,threshold,&local_98);
  uVar1 = local_98.nexamples_;
  dVar2 = Meter::precision(&local_98);
  dVar3 = Meter::recall(&local_98);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl = dVar3;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl = dVar2;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Head_base<0UL,_long,_false>._M_head_impl = uVar1;
  std::
  _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_98.labelMetrics_._M_h);
  if (local_98.metrics_.scoreVsTrue.
      super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.metrics_.scoreVsTrue.
                    super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.metrics_.scoreVsTrue.
                          super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.metrics_.scoreVsTrue.
                          super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter(false);
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}